

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initMakeData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QLatin1String local_ba8;
  char local_b91;
  QLatin1String local_b90;
  char local_b79;
  QLatin1String local_b78;
  char local_b61;
  pair<char,_QLatin1String> local_b60;
  pair<char,_QLatin1String> pStack_b48;
  pair<char,_QLatin1String> pStack_b30;
  iterator local_b18;
  undefined8 local_b10;
  QMultiHash<char,_QLatin1String> local_b08;
  QMultiHash<char,_QLatin1String> local_af8;
  QLatin1String local_ae8;
  char local_ad1;
  QLatin1String local_ad0;
  char local_ab9;
  pair<char,_QLatin1String> local_ab8;
  pair<char,_QLatin1String> pStack_aa0;
  iterator local_a88;
  undefined8 local_a80;
  QMultiHash<char,_QLatin1String> local_a78;
  QLatin1String local_a68;
  char local_a51;
  QLatin1String local_a50;
  char local_a39;
  QLatin1String local_a38;
  char local_a21;
  QLatin1String local_a20;
  char local_a09;
  QLatin1String local_a08;
  char local_9f1;
  QLatin1String local_9f0;
  char local_9d9;
  QLatin1String local_9d8;
  char local_9c1;
  QLatin1String local_9c0;
  char local_9a9;
  QLatin1String local_9a8;
  char local_991;
  QLatin1String local_990;
  char local_979;
  QLatin1String local_978;
  char local_961;
  QLatin1String local_960;
  char local_949;
  QLatin1String local_948;
  char local_931;
  QLatin1String local_930;
  char local_919;
  QLatin1String local_918;
  char local_901;
  QLatin1String local_900;
  char local_8e9;
  QLatin1String local_8e8;
  char local_8d1;
  QLatin1String local_8d0;
  char local_8b9;
  QLatin1String local_8b8;
  char local_8a1;
  QLatin1String local_8a0;
  char local_889;
  QLatin1String local_888;
  char local_871;
  QLatin1String local_870;
  char local_859;
  QLatin1String local_858;
  char local_841;
  QLatin1String local_840;
  char local_829;
  QLatin1String local_828;
  char local_811;
  QLatin1String local_810;
  char local_7f9;
  QLatin1String local_7f8;
  char local_7e1;
  QLatin1String local_7e0;
  char local_7c9;
  QLatin1String local_7c8;
  char local_7b1;
  QLatin1String local_7b0;
  char local_799;
  QLatin1String local_798;
  char local_781;
  QLatin1String local_780;
  char local_769;
  QLatin1String local_768;
  char local_751;
  QLatin1String local_750;
  char local_739;
  QLatin1String local_738;
  char local_721;
  QLatin1String local_720;
  char local_709;
  QLatin1String local_708;
  char local_6f1;
  QLatin1String local_6f0;
  char local_6d9;
  QLatin1String local_6d8;
  char local_6c1;
  pair<char,_QLatin1String> local_6c0;
  pair<char,_QLatin1String> pStack_6a8;
  pair<char,_QLatin1String> pStack_690;
  pair<char,_QLatin1String> pStack_678;
  pair<char,_QLatin1String> pStack_660;
  pair<char,_QLatin1String> pStack_648;
  pair<char,_QLatin1String> pStack_630;
  pair<char,_QLatin1String> pStack_618;
  pair<char,_QLatin1String> pStack_600;
  pair<char,_QLatin1String> pStack_5e8;
  pair<char,_QLatin1String> pStack_5d0;
  pair<char,_QLatin1String> pStack_5b8;
  pair<char,_QLatin1String> pStack_5a0;
  pair<char,_QLatin1String> pStack_588;
  pair<char,_QLatin1String> pStack_570;
  pair<char,_QLatin1String> pStack_558;
  pair<char,_QLatin1String> pStack_540;
  pair<char,_QLatin1String> pStack_528;
  pair<char,_QLatin1String> pStack_510;
  pair<char,_QLatin1String> pStack_4f8;
  pair<char,_QLatin1String> pStack_4e0;
  pair<char,_QLatin1String> pStack_4c8;
  pair<char,_QLatin1String> pStack_4b0;
  pair<char,_QLatin1String> pStack_498;
  pair<char,_QLatin1String> pStack_480;
  pair<char,_QLatin1String> pStack_468;
  pair<char,_QLatin1String> pStack_450;
  pair<char,_QLatin1String> pStack_438;
  pair<char,_QLatin1String> pStack_420;
  pair<char,_QLatin1String> pStack_408;
  pair<char,_QLatin1String> pStack_3f0;
  pair<char,_QLatin1String> pStack_3d8;
  pair<char,_QLatin1String> pStack_3c0;
  pair<char,_QLatin1String> pStack_3a8;
  pair<char,_QLatin1String> pStack_390;
  pair<char,_QLatin1String> pStack_378;
  pair<char,_QLatin1String> pStack_360;
  pair<char,_QLatin1String> pStack_348;
  pair<char,_QLatin1String> pStack_330;
  iterator local_318;
  undefined8 local_310;
  QMultiHash<char,_QLatin1String> local_308;
  QLatin1String local_2f8;
  char local_2e1;
  QLatin1String local_2e0;
  char local_2c9;
  QLatin1String local_2c8;
  char local_2b1;
  QLatin1String local_2b0;
  char local_299;
  QLatin1String local_298;
  char local_281;
  QLatin1String local_280;
  char local_269;
  QLatin1String local_268;
  char local_251;
  QLatin1String local_250;
  char local_239;
  QLatin1String local_238;
  char local_221;
  QLatin1String local_220;
  char local_209;
  QLatin1String local_208;
  char local_1f1;
  QLatin1String local_1f0;
  char local_1d9;
  QLatin1String local_1d8;
  char local_1c1;
  QLatin1String local_1c0;
  char local_1a9;
  QLatin1String local_1a8;
  char local_191;
  pair<char,_QLatin1String> local_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_191 = 'i';
  QLatin1String::QLatin1String(&local_1a8,"include");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_190,&local_191,&local_1a8);
  local_1a9 = 'd';
  QLatin1String::QLatin1String(&local_1c0,"define");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_178,&local_1a9,&local_1c0)
  ;
  local_1c1 = 'e';
  QLatin1String::QLatin1String(&local_1d8,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_160,&local_1c1,&local_1d8)
  ;
  local_1d9 = 'e';
  QLatin1String::QLatin1String(&local_1f0,"endef");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_148,&local_1d9,&local_1f0)
  ;
  local_1f1 = 'e';
  QLatin1String::QLatin1String(&local_208,"endif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_130,&local_1f1,&local_208)
  ;
  local_209 = 'e';
  QLatin1String::QLatin1String(&local_220,"export");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_118,&local_209,&local_220)
  ;
  local_221 = 'i';
  QLatin1String::QLatin1String(&local_238,"ifn?def");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_100,&local_221,&local_238)
  ;
  local_239 = 'i';
  QLatin1String::QLatin1String(&local_250,"ifn?eq");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e8,&local_239,&local_250);
  local_251 = 'i';
  QLatin1String::QLatin1String(&local_268,"include");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_d0,&local_251,&local_268);
  local_269 = 'o';
  QLatin1String::QLatin1String(&local_280,"override");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b8,&local_269,&local_280);
  local_281 = 'p';
  QLatin1String::QLatin1String(&local_298,"private");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a0,&local_281,&local_298);
  local_299 = 's';
  QLatin1String::QLatin1String(&local_2b0,"sinclude");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_88,&local_299,&local_2b0);
  local_2b1 = 'u';
  QLatin1String::QLatin1String(&local_2c8,"undefine");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_70,&local_2b1,&local_2c8);
  local_2c9 = 'u';
  QLatin1String::QLatin1String(&local_2e0,"unexport");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_2c9,&local_2e0);
  local_2e1 = 'v';
  QLatin1String::QLatin1String(&local_2f8,"vpath");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_2e1,&local_2f8);
  local_28 = &local_190;
  local_20 = 0xf;
  list_02._M_len = 0xf;
  list_02._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&make_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  local_6c1 = 'a';
  QLatin1String::QLatin1String(&local_6d8,"addsuffix");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_6c0,&local_6c1,&local_6d8);
  local_6d9 = 'a';
  QLatin1String::QLatin1String(&local_6f0,"abspath");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6a8,&local_6d9,&local_6f0)
  ;
  local_6f1 = 'a';
  QLatin1String::QLatin1String(&local_708,"and");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_690,&local_6f1,&local_708)
  ;
  local_709 = 'a';
  QLatin1String::QLatin1String(&local_720,"ar");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_678,&local_709,&local_720)
  ;
  local_721 = 'b';
  QLatin1String::QLatin1String(&local_738,"basename");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_660,&local_721,&local_738)
  ;
  local_739 = 'c';
  QLatin1String::QLatin1String(&local_750,"call");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_648,&local_739,&local_750)
  ;
  local_751 = 'd';
  QLatin1String::QLatin1String(&local_768,"dir");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_630,&local_751,&local_768)
  ;
  local_769 = 'e';
  QLatin1String::QLatin1String(&local_780,"error");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_618,&local_769,&local_780)
  ;
  local_781 = 'e';
  QLatin1String::QLatin1String(&local_798,"eval");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_600,&local_781,&local_798)
  ;
  local_799 = 'f';
  QLatin1String::QLatin1String(&local_7b0,"file");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5e8,&local_799,&local_7b0)
  ;
  local_7b1 = 'f';
  QLatin1String::QLatin1String(&local_7c8,"filter");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5d0,&local_7b1,&local_7c8)
  ;
  local_7c9 = 'f';
  QLatin1String::QLatin1String(&local_7e0,"find");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5b8,&local_7c9,&local_7e0)
  ;
  local_7e1 = 'f';
  QLatin1String::QLatin1String(&local_7f8,"findstring");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5a0,&local_7e1,&local_7f8)
  ;
  local_7f9 = 'f';
  QLatin1String::QLatin1String(&local_810,"firstword");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_588,&local_7f9,&local_810)
  ;
  local_811 = 'f';
  QLatin1String::QLatin1String(&local_828,"flavor");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_570,&local_811,&local_828)
  ;
  local_829 = 'f';
  QLatin1String::QLatin1String(&local_840,"foreach");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_558,&local_829,&local_840)
  ;
  local_841 = 'g';
  QLatin1String::QLatin1String(&local_858,"guile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_540,&local_841,&local_858)
  ;
  local_859 = 'i';
  QLatin1String::QLatin1String(&local_870,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_528,&local_859,&local_870)
  ;
  local_871 = 'i';
  QLatin1String::QLatin1String(&local_888,"info");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_510,&local_871,&local_888)
  ;
  local_889 = 'i';
  QLatin1String::QLatin1String(&local_8a0,"install");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4f8,&local_889,&local_8a0)
  ;
  local_8a1 = 'j';
  QLatin1String::QLatin1String(&local_8b8,"join");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4e0,&local_8a1,&local_8b8)
  ;
  local_8b9 = 'l';
  QLatin1String::QLatin1String(&local_8d0,"lastword");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4c8,&local_8b9,&local_8d0)
  ;
  local_8d1 = 'l';
  QLatin1String::QLatin1String(&local_8e8,"load");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4b0,&local_8d1,&local_8e8)
  ;
  local_8e9 = 'n';
  QLatin1String::QLatin1String(&local_900,"notdir");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_498,&local_8e9,&local_900)
  ;
  local_901 = 'o';
  QLatin1String::QLatin1String(&local_918,"or");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_480,&local_901,&local_918)
  ;
  local_919 = 'o';
  QLatin1String::QLatin1String(&local_930,"origin");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_468,&local_919,&local_930)
  ;
  local_931 = 'p';
  QLatin1String::QLatin1String(&local_948,"patsubst");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_450,&local_931,&local_948)
  ;
  local_949 = 'r';
  QLatin1String::QLatin1String(&local_960,"ranlib");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_438,&local_949,&local_960)
  ;
  local_961 = 'r';
  QLatin1String::QLatin1String(&local_978,"realpath");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_420,&local_961,&local_978)
  ;
  local_979 = 'r';
  QLatin1String::QLatin1String(&local_990,"rm");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_408,&local_979,&local_990)
  ;
  local_991 = 's';
  QLatin1String::QLatin1String(&local_9a8,"shell");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3f0,&local_991,&local_9a8)
  ;
  local_9a9 = 's';
  QLatin1String::QLatin1String(&local_9c0,"sort");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3d8,&local_9a9,&local_9c0)
  ;
  local_9c1 = 's';
  QLatin1String::QLatin1String(&local_9d8,"strip");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3c0,&local_9c1,&local_9d8)
  ;
  local_9d9 = 's';
  QLatin1String::QLatin1String(&local_9f0,"subst");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3a8,&local_9d9,&local_9f0)
  ;
  local_9f1 = 's';
  QLatin1String::QLatin1String(&local_a08,"suffix");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_390,&local_9f1,&local_a08)
  ;
  local_a09 = 'v';
  QLatin1String::QLatin1String(&local_a20,"value");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_378,&local_a09,&local_a20)
  ;
  local_a21 = 'w';
  QLatin1String::QLatin1String(&local_a38,"warning");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_360,&local_a21,&local_a38)
  ;
  local_a39 = 'w';
  QLatin1String::QLatin1String(&local_a50,"wildcard");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_348,&local_a39,&local_a50)
  ;
  local_a51 = 'w';
  QLatin1String::QLatin1String(&local_a68,"word");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_330,&local_a51,&local_a68)
  ;
  local_318 = &local_6c0;
  local_310 = 0x27;
  list_01._M_len = 0x27;
  list_01._M_array = local_318;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_308,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&make_types,&local_308);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_308);
  local_ab9 = 't';
  QLatin1String::QLatin1String(&local_ad0,"true");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_ab8,&local_ab9,&local_ad0);
  local_ad1 = 'f';
  QLatin1String::QLatin1String(&local_ae8,"false");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_aa0,&local_ad1,&local_ae8)
  ;
  local_a88 = &local_ab8;
  local_a80 = 2;
  list_00._M_len = 2;
  list_00._M_array = local_a88;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_a78,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&make_literals,&local_a78);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_a78);
  memset(&local_af8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_af8);
  QMultiHash<char,_QLatin1String>::operator=(&make_builtin,&local_af8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_af8);
  local_b61 = 'C';
  QLatin1String::QLatin1String(&local_b78,"CFLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_b60,&local_b61,&local_b78);
  local_b79 = 'L';
  QLatin1String::QLatin1String(&local_b90,"LIBS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b48,&local_b79,&local_b90)
  ;
  local_b91 = 'P';
  QLatin1String::QLatin1String(&local_ba8,"PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b30,&local_b91,&local_ba8)
  ;
  local_b18 = &local_b60;
  local_b10 = 3;
  list._M_len = 3;
  list._M_array = local_b18;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_b08,list);
  QMultiHash<char,_QLatin1String>::operator=(&make_other,&local_b08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_b08);
  return;
}

Assistant:

void initMakeData() {
    make_keywords = {
        {'i', QLatin1String("include")},  {'d', QLatin1String("define")},
        {'e', QLatin1String("else")},     {'e', QLatin1String("endef")},
        {'e', QLatin1String("endif")},    {'e', QLatin1String("export")},
        {'i', QLatin1String("ifn?def")},  {'i', QLatin1String("ifn?eq")},
        {'i', QLatin1String("include")},  {'o', QLatin1String("override")},
        {'p', QLatin1String("private")},  {'s', QLatin1String("sinclude")},
        {'u', QLatin1String("undefine")}, {'u', QLatin1String("unexport")},
        {'v', QLatin1String("vpath")}};
    make_types = {
        {'a', QLatin1String("addsuffix")},  {'a', QLatin1String("abspath")},
        {'a', QLatin1String("and")},        {'a', QLatin1String("ar")},
        {'b', QLatin1String("basename")},   {'c', QLatin1String("call")},
        {'d', QLatin1String("dir")},        {'e', QLatin1String("error")},
        {'e', QLatin1String("eval")},       {'f', QLatin1String("file")},
        {'f', QLatin1String("filter")},     {'f', QLatin1String("find")},
        {'f', QLatin1String("findstring")}, {'f', QLatin1String("firstword")},
        {'f', QLatin1String("flavor")},     {'f', QLatin1String("foreach")},
        {'g', QLatin1String("guile")},      {'i', QLatin1String("if")},
        {'i', QLatin1String("info")},       {'i', QLatin1String("install")},
        {'j', QLatin1String("join")},       {'l', QLatin1String("lastword")},
        {'l', QLatin1String("load")},       {'n', QLatin1String("notdir")},
        {'o', QLatin1String("or")},         {'o', QLatin1String("origin")},
        {'p', QLatin1String("patsubst")},   {'r', QLatin1String("ranlib")},
        {'r', QLatin1String("realpath")},   {'r', QLatin1String("rm")},
        {'s', QLatin1String("shell")},      {'s', QLatin1String("sort")},
        {'s', QLatin1String("strip")},      {'s', QLatin1String("subst")},
        {'s', QLatin1String("suffix")},     {'v', QLatin1String("value")},
        {'w', QLatin1String("warning")},    {'w', QLatin1String("wildcard")},
        {'w', QLatin1String("word")}};
    make_literals = {
        {'t', QLatin1String("true")},
        {'f', QLatin1String("false")},
    };
    make_builtin = {};
    make_other = {
        {'C', QLatin1String("CFLAGS")},
        {'L', QLatin1String("LIBS")},
        {'P', QLatin1String("PREFIX")},
    };
}